

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

double kj::anon_unknown_39::parseDouble(StringPtr *s)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  Fault local_48;
  Fault f_1;
  double value;
  char *endPtr;
  Fault local_20;
  Fault f;
  StringPtr *s_local;
  
  f.exception = (Exception *)s;
  bVar1 = StringPtr::operator!=(s,(void *)0x0);
  if (bVar1) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = StringPtr::begin((StringPtr *)f.exception);
    f_1.exception = (Exception *)strtod(pcVar3,(char **)&value);
    pcVar3 = StringPtr::end((StringPtr *)f.exception);
    if ((char *)value == pcVar3) {
      s_local = (StringPtr *)f_1.exception;
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46],kj::StringPtr_const&>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                 ,0x54,FAILED,"endPtr == s.end()",
                 "\"String does not contain valid floating number\", s",
                 (char (*) [46])"String does not contain valid floating number",
                 (StringPtr *)f.exception);
      s_local = (StringPtr *)0x0;
      _::Debug::Fault::~Fault(&local_48);
    }
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],kj::StringPtr_const&>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
               ,0x50,FAILED,"s != nullptr","\"String does not contain valid number\", s",
               (char (*) [37])"String does not contain valid number",(StringPtr *)f.exception);
    s_local = (StringPtr *)0x0;
    _::Debug::Fault::~Fault(&local_20);
  }
  return (double)s_local;
}

Assistant:

double parseDouble(const StringPtr& s) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtod(s.begin(), &endPtr);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid floating number", s) { return 0; }
#if _WIN32 || __CYGWIN__ || __BIONIC__
  // When Windows' strtod() parses "nan", it returns a value with the sign bit set. But, our
  // preferred canonical value for NaN does not have the sign bit set, and all other platforms
  // return one without the sign bit set. So, on Windows, detect NaN and return our preferred
  // version.
  //
  // Cygwin seemingly does not try to emulate Linux behavior here, but rather allows Windows'
  // behavior to leak through. (Conversely, WINE actually produces the Linux behavior despite
  // trying to behave like Win32...)
  //
  // Bionic (Android) failed the unit test and so I added it to the list without investigating
  // further.
  if (isNaN(value)) {
    // NaN
    return kj::nan();
  }
#endif
  return value;
}